

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

pair<std::unique_lock<std::mutex>,_std::unordered_map<XrInstance_T_*,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>_>_>_>_&>
* __thiscall
HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::lockMap
          (pair<std::unique_lock<std::mutex>,_std::unordered_map<XrInstance_T_*,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<GenValidUsageXrInstanceInfo,_std::default_delete<GenValidUsageXrInstanceInfo>_>_>_>_>_&>
           *__return_storage_ptr__,HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo> *this
          )

{
  mutex_type *pmVar1;
  unique_lock<std::mutex> local_28;
  
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->dispatch_mutex_);
  pmVar1 = local_28._M_device;
  local_28._M_device = (mutex_type *)0x0;
  (__return_storage_ptr__->first)._M_device = pmVar1;
  (__return_storage_ptr__->first)._M_owns = local_28._M_owns;
  local_28._M_owns = false;
  __return_storage_ptr__->second = &this->info_map_;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<UniqueLock, typename HandleInfoBase<HT, IT>::map_t &> HandleInfoBase<HT, IT>::lockMap() {
    return {UniqueLock(dispatch_mutex_), info_map_};
}